

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O0

void __thiscall iqxmlrpc::Value::Value(Value *this,string *s)

{
  Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  string *s_local;
  Value *this_local;
  
  this->_vptr_Value = (_func_int **)&PTR__Value_00254828;
  this_00 = (Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x28);
  Scalar<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Scalar
            (this_00,s);
  this->value = (Value_type *)this_00;
  return;
}

Assistant:

Value::Value( std::string s ):
  value( new String(s) )
{
}